

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# INTEGER.c
# Opt level: O1

asn_dec_rval_t
INTEGER_decode_uper(asn_codec_ctx_t *opt_codec_ctx,asn_TYPE_descriptor_t *td,
                   asn_per_constraints_t *constraints,void **sptr,asn_per_data_t *pd)

{
  asn_per_constraint_flags aVar1;
  uint uVar2;
  void *pvVar3;
  int32_t iVar4;
  int iVar5;
  INTEGER_t *iptr;
  uint8_t *puVar6;
  ssize_t sVar7;
  asn_per_constraints_t *paVar8;
  ulong uVar9;
  unsigned_long value;
  ulong uVar10;
  bool bVar11;
  asn_dec_rval_t aVar12;
  unsigned_long uvalue;
  int repeat;
  unsigned_long local_48;
  int local_3c;
  void *local_38;
  
  pvVar3 = td->specifics;
  iptr = (INTEGER_t *)*sptr;
  if (iptr == (INTEGER_t *)0x0) {
    iptr = (INTEGER_t *)calloc(1,0x10);
    *sptr = iptr;
    if (iptr != (INTEGER_t *)0x0) goto LAB_00140102;
LAB_001401c2:
    uVar9 = 2;
    goto LAB_00140342;
  }
LAB_00140102:
  if (constraints == (asn_per_constraints_t *)0x0) {
    constraints = td->per_constraints;
  }
  local_38 = pvVar3;
  if (constraints == (asn_per_constraints_t *)0x0) {
    paVar8 = (asn_per_constraints_t *)0x0;
  }
  else {
    paVar8 = constraints;
    if (((constraints->value).flags & APC_EXTENSIBLE) != APC_UNCONSTRAINED) {
      uVar9 = 1;
      iVar4 = per_get_few_bits(pd,1);
      paVar8 = (asn_per_constraints_t *)0x0;
      if (iVar4 == 0) {
        paVar8 = constraints;
      }
      if (iVar4 < 0) goto LAB_00140342;
    }
  }
  free(iptr->buf);
  iptr->buf = (uint8_t *)0x0;
  iptr->size = 0;
  if (paVar8 != (asn_per_constraints_t *)0x0) {
    aVar1 = (paVar8->value).flags;
    if ((aVar1 & APC_SEMI_CONSTRAINED) == APC_UNCONSTRAINED) {
      if (((aVar1 & APC_CONSTRAINED) != APC_UNCONSTRAINED) &&
         (uVar2 = (paVar8->value).range_bits, -1 < (int)uVar2)) {
        uVar9 = (ulong)uVar2 + 7 >> 3;
        puVar6 = (uint8_t *)malloc(uVar9 + 2);
        iptr->buf = puVar6;
        if (puVar6 == (uint8_t *)0x0) {
          uVar9 = 2;
          goto LAB_00140342;
        }
        iptr->size = (int)uVar9;
      }
    }
    else {
      puVar6 = (uint8_t *)calloc(1,2);
      iptr->buf = puVar6;
      if (puVar6 == (uint8_t *)0x0) goto LAB_001401c2;
      iptr->size = 1;
    }
  }
  uVar10 = 1;
  uVar9 = uVar10;
  if (((paVar8 == (asn_per_constraints_t *)0x0) || ((paVar8->value).flags == APC_UNCONSTRAINED)) ||
     (uVar2 = (paVar8->value).range_bits, (int)uVar2 < 0)) {
    do {
      sVar7 = uper_get_length(pd,-1,&local_3c);
      if (sVar7 < 0) {
LAB_001402ad:
        bVar11 = false;
        uVar9 = 1;
      }
      else {
        puVar6 = (uint8_t *)realloc(iptr->buf,sVar7 + iptr->size + 1);
        if (puVar6 == (uint8_t *)0x0) {
          uVar9 = 2;
          bVar11 = false;
        }
        else {
          iptr->buf = puVar6;
          iVar5 = per_get_many_bits(pd,puVar6 + iptr->size,0,(int)sVar7 * 8);
          if (iVar5 < 0) goto LAB_001402ad;
          iptr->size = iptr->size + (int)sVar7;
          bVar11 = true;
        }
      }
      if (!bVar11) goto LAB_00140342;
    } while (local_3c != 0);
    iptr->buf[iptr->size] = '\0';
    if ((paVar8 != (asn_per_constraints_t *)0x0) && ((paVar8->value).lower_bound != 0)) {
      iVar5 = asn_INTEGER2long(iptr,(long *)&local_48);
      if (iVar5 != 0) {
        uVar9 = 2;
        goto LAB_0014030c;
      }
      value = (paVar8->value).lower_bound + local_48;
LAB_00140326:
      iVar5 = asn_long2INTEGER(iptr,value);
      uVar10 = uVar9;
LAB_0014032e:
      bVar11 = iVar5 == 0;
      uVar9 = 2;
      if (bVar11) {
        uVar9 = uVar10;
      }
      goto LAB_0014033c;
    }
  }
  else {
    uVar9 = 2;
    if (0x40 < uVar2) goto LAB_00140342;
    if ((local_38 == (void *)0x0) || (*(int *)((long)local_38 + 0x20) == 0)) {
      iVar5 = uper_get_constrained_whole_number(pd,&local_48,(paVar8->value).range_bits);
      if (iVar5 == 0) {
        value = local_48 + (paVar8->value).lower_bound;
        uVar9 = uVar10;
        local_48 = value;
        goto LAB_00140326;
      }
    }
    else {
      iVar5 = uper_get_constrained_whole_number(pd,&local_48,(paVar8->value).range_bits);
      if (iVar5 == 0) {
        local_48 = local_48 + (paVar8->value).lower_bound;
        iVar5 = asn_ulong2INTEGER(iptr,local_48);
        goto LAB_0014032e;
      }
    }
    uVar9 = 1;
LAB_0014030c:
    bVar11 = false;
LAB_0014033c:
    if (!bVar11) goto LAB_00140342;
  }
  uVar9 = 0;
LAB_00140342:
  aVar12.consumed = 0;
  aVar12._0_8_ = uVar9;
  return aVar12;
}

Assistant:

asn_dec_rval_t
INTEGER_decode_uper(asn_codec_ctx_t *opt_codec_ctx, asn_TYPE_descriptor_t *td,
	asn_per_constraints_t *constraints, void **sptr, asn_per_data_t *pd) {
	asn_INTEGER_specifics_t *specs=(asn_INTEGER_specifics_t *)td->specifics;
	asn_dec_rval_t rval = { RC_OK, 0 };
	INTEGER_t *st = (INTEGER_t *)*sptr;
	asn_per_constraint_t *ct;
	int repeat;

	(void)opt_codec_ctx;

	if(!st) {
		st = (INTEGER_t *)(*sptr = CALLOC(1, sizeof(*st)));
		if(!st) ASN__DECODE_FAILED;
	}

	if(!constraints) constraints = td->per_constraints;
	ct = constraints ? &constraints->value : 0;

	if(ct && ct->flags & APC_EXTENSIBLE) {
		int inext = per_get_few_bits(pd, 1);
		if(inext < 0) ASN__DECODE_STARVED;
		if(inext) ct = 0;
	}

	FREEMEM(st->buf);
	st->buf = 0;
	st->size = 0;
	if(ct) {
		if(ct->flags & APC_SEMI_CONSTRAINED) {
			st->buf = (uint8_t *)CALLOC(1, 2);
			if(!st->buf) ASN__DECODE_FAILED;
			st->size = 1;
		} else if(ct->flags & APC_CONSTRAINED && ct->range_bits >= 0) {
			size_t size = (ct->range_bits + 7) >> 3;
			st->buf = (uint8_t *)MALLOC(1 + size + 1);
			if(!st->buf) ASN__DECODE_FAILED;
			st->size = size;
		}
	}

	/* X.691-2008/11, #13.2.2, constrained whole number */
	if(ct && ct->flags != APC_UNCONSTRAINED) {
		/* #11.5.6 */
		ASN_DEBUG("Integer with range %d bits", ct->range_bits);
		if(ct->range_bits >= 0) {
			if((size_t)ct->range_bits > 8 * sizeof(unsigned long))
				ASN__DECODE_FAILED;

			if(specs && specs->field_unsigned) {
				unsigned long uvalue;
				if(uper_get_constrained_whole_number(pd,
					&uvalue, ct->range_bits))
					ASN__DECODE_STARVED;
				ASN_DEBUG("Got value %lu + low %ld",
					uvalue, ct->lower_bound);
				uvalue += ct->lower_bound;
				if(asn_ulong2INTEGER(st, uvalue))
					ASN__DECODE_FAILED;
			} else {
				unsigned long svalue;
				if(uper_get_constrained_whole_number(pd,
					&svalue, ct->range_bits))
					ASN__DECODE_STARVED;
				ASN_DEBUG("Got value %ld + low %ld",
					svalue, ct->lower_bound);
				svalue += ct->lower_bound;
				if(asn_long2INTEGER(st, svalue))
					ASN__DECODE_FAILED;
			}
			return rval;
		}
	} else {
		ASN_DEBUG("Decoding unconstrained integer %s", td->name);
	}

	/* X.691, #12.2.3, #12.2.4 */
	do {
		ssize_t len;
		void *p;
		int ret;

		/* Get the PER length */
		len = uper_get_length(pd, -1, &repeat);
		if(len < 0) ASN__DECODE_STARVED;

		p = REALLOC(st->buf, st->size + len + 1);
		if(!p) ASN__DECODE_FAILED;
		st->buf = (uint8_t *)p;

		ret = per_get_many_bits(pd, &st->buf[st->size], 0, 8 * len);
		if(ret < 0) ASN__DECODE_STARVED;
		st->size += len;
	} while(repeat);
	st->buf[st->size] = 0;	/* JIC */

	/* #12.2.3 */
	if(ct && ct->lower_bound) {
		/*
		 * TODO: replace by in-place arithmetics.
		 */
		long value;
		if(asn_INTEGER2long(st, &value))
			ASN__DECODE_FAILED;
		if(asn_long2INTEGER(st, value + ct->lower_bound))
			ASN__DECODE_FAILED;
	}

	return rval;
}